

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cc
# Opt level: O3

void * calloc(size_t __nmemb,size_t __size)

{
  ulong uVar1;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  byte bVar2;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *self;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t result;
  size_t size;
  void *pvVar5;
  Alloc<void> AVar6;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  c;
  undefined8 *in_FS_OFFSET;
  anon_class_1_0_00000001 local_9;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = __size;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = __nmemb;
  size = SUB168(auVar3 * auVar4,0);
  if (SUB168(auVar3 * auVar4,8) != 0) {
    pvVar5 = snmalloc::libc::set_error(0xc);
    return pvVar5;
  }
  self = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar1 = size - 1;
  if (0xdfff < uVar1) {
    AVar6 = snmalloc::
            Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
            alloc_not_small<(snmalloc::ZeroMem)1,snmalloc::CheckInitPthread>(size,self);
    return AVar6.unsafe_capptr;
  }
  bVar2 = (&snmalloc::sizeclass_lookup)[uVar1 >> 4];
  fl = (self->super_FastFreeLists).small_fast_free_lists + bVar2;
  AVar6.unsafe_capptr = (fl->curr).unsafe_capptr;
  if ((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
       *)AVar6.unsafe_capptr ==
      (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
       *)0x0) {
    if ((self->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
        (self->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      AVar6 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              small_alloc<(snmalloc::ZeroMem)1,_snmalloc::CheckInitPthread>::anon_class_1_0_00000001
              ::operator()(&local_9,self,(ulong)bVar2,fl);
    }
    else {
      AVar6 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
              handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)1,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                        ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)self);
    }
  }
  else {
    (fl->curr).unsafe_capptr =
         (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          *)((T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
              *)AVar6.unsafe_capptr)->field_0;
    uVar1 = *(ulong *)(snmalloc::sizeclass_metadata + (ulong)bVar2 * 0x20 + 0x800);
    if ((uVar1 < 0x10001) || ((((uint)AVar6.unsafe_capptr | (uint)uVar1) & 0xfff) != 0)) {
      pvVar5 = memset(AVar6.unsafe_capptr,0,uVar1);
      return pvVar5;
    }
    madvise(AVar6.unsafe_capptr,uVar1,4);
  }
  return (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          *)AVar6.unsafe_capptr;
}

Assistant:

SNMALLOC_EXPORT void* SNMALLOC_NAME_MANGLE(calloc)(size_t nmemb, size_t size)
  {
    return snmalloc::libc::calloc(nmemb, size);
  }